

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_cbs.c
# Opt level: O3

RK_S32 mpp_av1_render_size(AV1Context *ctx,BitReadCtx_t *gb,AV1RawFrameHeader *current)

{
  RK_S32 RVar1;
  ushort uVar2;
  RK_U32 value_2;
  RK_U32 value_1;
  RK_U32 value;
  ushort local_24 [2];
  RK_U16 local_20 [2];
  RK_U8 local_1c [4];
  
  RVar1 = mpp_av1_read_unsigned(gb,1,"render_and_frame_size_different",(RK_U32 *)local_1c,0,1);
  if (RVar1 < 0) {
    return RVar1;
  }
  current->render_and_frame_size_different = local_1c[0];
  if (local_1c[0] == '\0') {
    uVar2 = current->frame_width_minus_1;
    local_24[0] = current->frame_height_minus_1;
    current->render_width_minus_1 = uVar2;
    current->render_height_minus_1 = local_24[0];
LAB_001c29bf:
    ctx->render_width = uVar2 + 1;
    ctx->render_height = local_24[0] + 1;
    RVar1 = 0;
  }
  else {
    RVar1 = mpp_av1_read_unsigned(gb,0x10,"render_width_minus_1",(RK_U32 *)local_20,0,0xffff);
    if (-1 < RVar1) {
      current->render_width_minus_1 = local_20[0];
      RVar1 = mpp_av1_read_unsigned(gb,0x10,"render_height_minus_1",(RK_U32 *)local_24,0,0xffff);
      if (-1 < RVar1) {
        current->render_height_minus_1 = local_24[0];
        uVar2 = current->render_width_minus_1;
        goto LAB_001c29bf;
      }
    }
    RVar1 = -1;
  }
  return RVar1;
}

Assistant:

static RK_S32 mpp_av1_render_size(AV1Context *ctx, BitReadCtx_t *gb,
                                  AV1RawFrameHeader *current)
{
    RK_S32 err;

    flag(render_and_frame_size_different);

    if (current->render_and_frame_size_different) {
        fb(16, render_width_minus_1);
        fb(16, render_height_minus_1);
    } else {
        infer(render_width_minus_1,  current->frame_width_minus_1);
        infer(render_height_minus_1, current->frame_height_minus_1);
    }

    ctx->render_width  = current->render_width_minus_1  + 1;
    ctx->render_height = current->render_height_minus_1 + 1;

    return 0;
}